

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O2

void __thiscall HTML::TAG::TAG(TAG *this,string *tag,ostream *stream)

{
  ostream *poVar1;
  
  this->_vptr_TAG = (_func_int **)&PTR__TAG_001fcf78;
  std::__cxx11::string::string((string *)&this->m_tag,(string *)tag);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_value);
  this->m_stream = stream;
  poVar1 = std::operator<<(stream,"<");
  std::operator<<(poVar1,(string *)&this->m_tag);
  return;
}

Assistant:

TAG(const std::string &tag, std::ostream &stream)
      : m_tag(tag),
        m_stream(stream) {
    m_stream << "<" << m_tag;
  }